

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost.c
# Opt level: O1

int GetResidualCost_C(int ctx0,VP8Residual *res)

{
  byte bVar1;
  int iVar2;
  ProbaArray *paauVar3;
  int iVar4;
  uint8_t (*pauVar5) [11];
  uint uVar6;
  ushort uVar7;
  uint16_t *puVar8;
  long lVar9;
  long lVar10;
  CostArrayPtr papuVar11;
  ushort uVar12;
  ulong uVar13;
  
  iVar4 = res->first;
  lVar9 = (long)iVar4;
  paauVar3 = res->prob;
  bVar1 = paauVar3[lVar9][ctx0][0];
  uVar6 = 0;
  if (ctx0 == 0) {
    uVar6 = (uint)VP8EntropyCost[(byte)~bVar1];
  }
  iVar2 = res->last;
  if ((long)iVar2 < 0) {
    uVar6 = (uint)VP8EntropyCost[bVar1];
  }
  else {
    puVar8 = res->costs[lVar9][ctx0];
    if (iVar4 < iVar2) {
      papuVar11 = res->costs + lVar9;
      lVar10 = 0;
      do {
        papuVar11 = papuVar11 + 1;
        uVar7 = res->coeffs[lVar9 + lVar10];
        uVar12 = -uVar7;
        if (0 < (short)uVar7) {
          uVar12 = uVar7;
        }
        uVar13 = 0x43;
        if (uVar12 < 0x43) {
          uVar13 = (ulong)(uint)uVar12;
        }
        uVar6 = uVar6 + VP8LevelFixedCosts[uVar12] + (uint)puVar8[uVar13];
        uVar7 = 2;
        if (uVar12 < 2) {
          uVar7 = uVar12;
        }
        puVar8 = (*papuVar11)[uVar7];
        lVar10 = lVar10 + 1;
      } while (iVar2 - lVar9 != lVar10);
      iVar4 = iVar4 + (int)lVar10;
    }
    uVar7 = res->coeffs[iVar4];
    uVar12 = -uVar7;
    if (0 < (short)uVar7) {
      uVar12 = uVar7;
    }
    uVar13 = 0x43;
    if (uVar12 < 0x43) {
      uVar13 = (ulong)(uint)uVar12;
    }
    uVar6 = VP8LevelFixedCosts[uVar12] + uVar6 + (uint)puVar8[uVar13];
    if (iVar4 < 0xf) {
      pauVar5 = *paauVar3 + 1;
      if (uVar12 != 1) {
        pauVar5 = *paauVar3 + 2;
      }
      uVar6 = uVar6 + VP8EntropyCost
                      [*(byte *)((long)pauVar5 +
                                (ulong)""[(long)iVar4 + 1] * 0x20 + (ulong)""[(long)iVar4 + 1])];
    }
  }
  return uVar6;
}

Assistant:

static int GetResidualCost_C(int ctx0, const VP8Residual* const res) {
  int n = res->first;
  // should be prob[VP8EncBands[n]], but it's equivalent for n=0 or 1
  const int p0 = res->prob[n][ctx0][0];
  CostArrayPtr const costs = res->costs;
  const uint16_t* t = costs[n][ctx0];
  // bit_cost(1, p0) is already incorporated in t[] tables, but only if ctx != 0
  // (as required by the syntax). For ctx0 == 0, we need to add it here or it'll
  // be missing during the loop.
  int cost = (ctx0 == 0) ? VP8BitCost(1, p0) : 0;

  if (res->last < 0) {
    return VP8BitCost(0, p0);
  }
  for (; n < res->last; ++n) {
    const int v = abs(res->coeffs[n]);
    const int ctx = (v >= 2) ? 2 : v;
    cost += VP8LevelCost(t, v);
    t = costs[n + 1][ctx];
  }
  // Last coefficient is always non-zero
  {
    const int v = abs(res->coeffs[n]);
    assert(v != 0);
    cost += VP8LevelCost(t, v);
    if (n < 15) {
      const int b = VP8EncBands[n + 1];
      const int ctx = (v == 1) ? 1 : 2;
      const int last_p0 = res->prob[b][ctx][0];
      cost += VP8BitCost(0, last_p0);
    }
  }
  return cost;
}